

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoDGofR.cpp
# Opt level: O0

void __thiscall
OpenMD::TwoDGofR::TwoDGofR
          (TwoDGofR *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType len,
          RealType dz,int nrbins)

{
  StaticAnalyser *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  uint in_stack_0000029c;
  string *in_stack_000002a0;
  string *in_stack_000002a8;
  string *in_stack_000002b0;
  SimInfo *in_stack_000002b8;
  RadialDistrFunc *in_stack_000002c0;
  string *filename_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  string local_90 [8];
  size_type in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  string local_70 [56];
  undefined8 local_38;
  undefined8 local_30;
  
  local_38 = in_XMM1_Qa;
  local_30 = in_XMM0_Qa;
  RadialDistrFunc::RadialDistrFunc
            (in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,
             in_stack_000002a0,in_stack_0000029c);
  in_RDI->_vptr_StaticAnalyser = (_func_int **)&PTR__TwoDGofR_005605f0;
  *(undefined8 *)&in_RDI[0x14].dumpFilename_ = local_30;
  str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI[0x14].step_;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1e9d25);
  filename_00 = (string *)&in_RDI[0x14].outputFilename_.field_2;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1e9d3a);
  *(double *)&in_RDI[0x14].dumpFilename_.field_2 =
       *(double *)&in_RDI[0x14].dumpFilename_ / (double)in_RDI->nBins_;
  *(undefined8 *)((long)&in_RDI[0x14].dumpFilename_.field_2 + 8) = local_38;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  getPrefix(str);
  std::operator+(str,(char *)in_RDI);
  StaticAnalyser::setOutputName(in_RDI,filename_00);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

TwoDGofR::TwoDGofR(SimInfo* info, const std::string& filename,
                     const std::string& sele1, const std::string& sele2,
                     RealType len, RealType dz, int nrbins) :
      RadialDistrFunc(info, filename, sele1, sele2, nrbins),
      len_(len) {
    deltaR_ = len_ / nBins_;

    deltaZ_ = dz;

    histogram_.resize(nBins_);
    avgTwoDGofR_.resize(nBins_);

    setOutputName(getPrefix(filename) + ".TwoDGofR");
  }